

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

void __thiscall Assimp::Importer::SetIOHandler(Importer *this,IOSystem *pIOHandler)

{
  ImporterPimpl *pIVar1;
  IOSystem *pIVar2;
  
  if (pIOHandler == (IOSystem *)0x0) {
    pIVar2 = (IOSystem *)operator_new(0x20);
    (pIVar2->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar2->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar2->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar2->_vptr_IOSystem = (_func_int **)&PTR__IOSystem_007dbc40;
    this->pimpl->mIOHandler = pIVar2;
    this->pimpl->mIsDefaultHandler = true;
  }
  else {
    pIVar1 = this->pimpl;
    pIVar2 = pIVar1->mIOHandler;
    if (pIVar2 != pIOHandler) {
      if (pIVar2 != (IOSystem *)0x0) {
        (*pIVar2->_vptr_IOSystem[1])();
        pIVar1 = this->pimpl;
      }
      pIVar1->mIOHandler = pIOHandler;
      this->pimpl->mIsDefaultHandler = false;
    }
  }
  return;
}

Assistant:

void Importer::SetIOHandler( IOSystem* pIOHandler)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // If the new handler is zero, allocate a default IO implementation.
    if (!pIOHandler)
    {
        // Release pointer in the possession of the caller
        pimpl->mIOHandler = new DefaultIOSystem();
        pimpl->mIsDefaultHandler = true;
    }
    // Otherwise register the custom handler
    else if (pimpl->mIOHandler != pIOHandler)
    {
        delete pimpl->mIOHandler;
        pimpl->mIOHandler = pIOHandler;
        pimpl->mIsDefaultHandler = false;
    }
    ASSIMP_END_EXCEPTION_REGION(void);
}